

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_object.cpp
# Opt level: O1

string * __thiscall
mjs::not_callable_exception::format_error_message_abi_cxx11_
          (string *__return_storage_ptr__,not_callable_exception *this,value *v)

{
  ostringstream oss;
  undefined1 auStack_198 [128];
  ios_base local_118 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)(auStack_198 + 0x10));
  if (*(value_type *)this == object) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&this->field_0x8);
    object::class_name((object *)auStack_198);
    mjs::operator<<((ostream *)(auStack_198 + 0x10),(string *)auStack_198);
    gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_198);
  }
  else {
    mjs::operator<<((basic_ostream<char,_std::char_traits<char>_> *)(auStack_198 + 0x10),
                    *(value_type *)this);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(auStack_198 + 0x10)," is not a function",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(auStack_198 + 0x10));
  std::ios_base::~ios_base(local_118);
  return __return_storage_ptr__;
}

Assistant:

std::string not_callable_exception::format_error_message(const value& v) {
    std::ostringstream oss;
    if (v.type() == value_type::object) {
        oss << v.object_value()->class_name();
    } else {
        oss << v.type();
    }
    oss << " is not a function";
    return oss.str();
}